

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O2

int __thiscall
FormatTypeRAW::LoadTrack
          (FormatTypeRAW *this,IDisk **created_disk,char *file_path,int side,int track)

{
  pointer paVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  FILE *__stream;
  FluxElement *pFVar6;
  uint uVar7;
  uint FluxValue;
  
  this->last_stream_index_position_ = 0;
  this->finished_ = false;
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  this->stream_position_ = 0;
  this->size_of_flux_value_ = 0x1964;
  pFVar6 = (FluxElement *)operator_new__(52000);
  this->flux_list_ = pFVar6;
  this->nb_flux_value_ = 0;
  paVar1 = (this->index_list_).
           super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->index_list_).
      super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>.
      _M_impl.super__Vector_impl_data._M_finish != paVar1) {
    (this->index_list_).
    super__Vector_base<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>.
    _M_impl.super__Vector_impl_data._M_finish = paVar1;
  }
  bVar2 = false;
  FluxValue = 0;
switchD_0015000e_caseD_8:
  bVar3 = Get(this,(FILE *)__stream);
  if ((this->finished_ != false) || (iVar5 = feof(__stream), iVar5 != 0)) {
    fclose(__stream);
    ComputeTrack(this,created_disk,side,track);
    (*(*created_disk)->_vptr_IDisk[0x13])(*created_disk,(ulong)(uint)side,(ulong)(uint)track);
    if (this->flux_list_ == (FluxElement *)0x0) {
      return 0;
    }
    operator_delete__(this->flux_list_);
    return 0;
  }
  uVar7 = (uint)bVar3;
  switch(bVar3) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    if (!bVar2) {
      FluxValue = 0;
    }
    bVar4 = Get(this,(FILE *)__stream);
    uVar7 = (uint)bVar3 * 0x100 + FluxValue;
    FluxValue = (uint)bVar4;
    break;
  case 8:
    goto switchD_0015000e_caseD_8;
  case 10:
    Get(this,(FILE *)__stream);
  case 9:
    Get(this,(FILE *)__stream);
    goto switchD_0015000e_caseD_8;
  case 0xb:
    FluxValue = FluxValue + 0x10000;
    bVar2 = true;
    goto switchD_0015000e_caseD_8;
  case 0xc:
    if (!bVar2) {
      FluxValue = 0;
    }
    bVar3 = Get(this,(FILE *)__stream);
    bVar4 = Get(this,(FILE *)__stream);
    FluxValue = bVar4 + FluxValue + (uint)bVar3 * 0x100;
    InsertFluxValue(this,FluxValue);
    bVar2 = false;
    goto switchD_0015000e_caseD_8;
  case 0xd:
    this->stream_position_ = this->stream_position_ - 1;
    HandleOOB(this,(FILE *)__stream);
    goto switchD_0015000e_caseD_8;
  default:
    if (!bVar2) {
      FluxValue = 0;
    }
  }
  FluxValue = FluxValue + uVar7;
  InsertFluxValue(this,FluxValue);
  bVar2 = false;
  goto switchD_0015000e_caseD_8;
}

Assistant:

int FormatTypeRAW::LoadTrack(IDisk*& created_disk, const char* file_path, int side, int track)
{
   FILE* file;

   unsigned char h; // byte header

   unsigned int flux_value = 0;
   last_stream_index_position_ = 0;
   finished_ = false;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      bool overflow = false;
      stream_position_ = 0;
      size_of_flux_value_ = DEFAULT_FLUX_SIZE;

      flux_list_ = new FluxElement[size_of_flux_value_];
      nb_flux_value_ = 0;
      index_list_.clear();

      // Next byte header
      h = Get(file);

      while (!finished_ && !feof(file))
      {
         // decode
         switch (h)
         {
         case 0x0A:
            Get(file); // Skip this byte
         case 0x09:
            Get(file); // Skip this byte
         case 0x08:
            ; // Nothing : Skip header byte
            break;
         case 0x0B:
            // Overflow
            flux_value += 0x10000;
            overflow = true;
            break;
         case 0x0C:
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               unsigned char h2 = Get(file);
               flux_value += (h1 << 8) + h2;
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         case 0x0D:
            --stream_position_;
            HandleOOB(file);
            break;
         case 0:
         case 1:
         case 2:
         case 3:
         case 4:
         case 5:
         case 6:
         case 7: // Flux 2
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               flux_value += ((h << 8) + h1);
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         default: // Flux 1
            if (!overflow) flux_value = 0;

            flux_value += h;
            InsertFluxValue(flux_value);
            overflow = false;
            break;
         }

         // Next byte header
         h = Get(file);
      }

      fclose(file);

      // Compute datas
      ComputeTrack(created_disk, side, track);
      created_disk->CreateSingleTrackFromMultiRevolutions(side, track);

      delete[]flux_list_;
   }
   else
   {
      return -1;
   }

   return 0;
}